

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O2

int If_CutFilter(If_Set_t *pCutSet,If_Cut_t *pCut,int fSaveCut0)

{
  ushort uVar1;
  If_Cut_t *pDom;
  If_Cut_t **ppIVar2;
  int iVar3;
  short sVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  
  uVar5 = (ulong)pCutSet->nCuts;
  if (pCutSet->ppCuts[uVar5] != pCut) {
    __assert_fail("pCutSet->ppCuts[pCutSet->nCuts] == pCut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifCut.c"
                  ,0x96,"int If_CutFilter(If_Set_t *, If_Cut_t *, int)");
  }
  iVar7 = 0;
  do {
    sVar4 = (short)uVar5;
    if (sVar4 <= iVar7) {
      return 0;
    }
    lVar6 = (long)iVar7;
    pDom = pCutSet->ppCuts[lVar6];
    if ((byte)pDom->field_0x1f <= (byte)pCut->field_0x1f) {
      if ((pDom->uSign & ~pCut->uSign) == 0) {
        iVar3 = If_CutCheckDominance(pDom,pCut);
        if (iVar3 != 0) {
          return 1;
        }
        uVar5 = (ulong)(ushort)pCutSet->nCuts;
      }
      goto LAB_0030e415;
    }
    if (iVar7 == 0) {
      if (sVar4 < 2) {
        if ((fSaveCut0 == 0) || (sVar4 != 1)) goto LAB_0030e374;
        iVar7 = 0;
        uVar5 = 1;
      }
      else {
        if ((pCutSet->ppCuts[1]->field_0x1d & 0x40) == 0) goto LAB_0030e374;
        iVar7 = 0;
      }
    }
    else {
LAB_0030e374:
      if ((pCut->uSign & ~pDom->uSign) == 0) {
        iVar3 = If_CutCheckDominance(pCut,pDom);
        uVar1 = pCutSet->nCuts;
        uVar5 = (ulong)uVar1;
        if (iVar3 != 0) {
          for (; ppIVar2 = pCutSet->ppCuts, lVar6 < (short)uVar1; lVar6 = lVar6 + 1) {
            ppIVar2[lVar6] = ppIVar2[lVar6 + 1];
          }
          ppIVar2[(short)uVar1] = pDom;
          uVar5 = (ulong)(uVar1 - 1);
          pCutSet->nCuts = (short)(uVar1 - 1);
          iVar7 = iVar7 + -1;
        }
      }
    }
LAB_0030e415:
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

int If_CutFilter( If_Set_t * pCutSet, If_Cut_t * pCut, int fSaveCut0 )
{ 
    If_Cut_t * pTemp;
    int i, k;
    assert( pCutSet->ppCuts[pCutSet->nCuts] == pCut );
    for ( i = 0; i < pCutSet->nCuts; i++ )
    {
        pTemp = pCutSet->ppCuts[i];
        if ( pTemp->nLeaves > pCut->nLeaves )
        {
            // do not fiter the first cut
            if ( i == 0 && ((pCutSet->nCuts > 1 && pCutSet->ppCuts[1]->fUseless) || (fSaveCut0 && pCutSet->nCuts == 1)) )
                continue;
            // skip the non-contained cuts
            if ( (pTemp->uSign & pCut->uSign) != pCut->uSign )
                continue;
            // check containment seriously
            if ( If_CutCheckDominance( pCut, pTemp ) )
            {
//                p->ppCuts[i] = p->ppCuts[p->nCuts-1];
//                p->ppCuts[p->nCuts-1] = pTemp;
//                p->nCuts--;
//                i--;
                // remove contained cut
                for ( k = i; k < pCutSet->nCuts; k++ )
                    pCutSet->ppCuts[k] = pCutSet->ppCuts[k+1];
                pCutSet->ppCuts[pCutSet->nCuts] = pTemp;
                pCutSet->nCuts--;
                i--;
            }
         }
        else
        {
            // skip the non-contained cuts
            if ( (pTemp->uSign & pCut->uSign) != pTemp->uSign )
                continue;
            // check containment seriously
            if ( If_CutCheckDominance( pTemp, pCut ) )
                return 1;
        }
    }
    return 0;
}